

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot_playground.cpp
# Opt level: O3

ostream * operator<<(ostream *os,fsm_def *sm)

{
  pointer pbVar1;
  pointer ptVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *state;
  pointer pbVar4;
  transition *transition;
  pointer ptVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"digraph ",8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(sm->name)._M_dataplus._M_p,(sm->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," {\n",3);
  fsm_def::get_states_abi_cxx11_(&local_48,sm);
  for (; local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,((local_48.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,";\n",2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  pbVar1 = (sm->general_options).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (sm->general_options).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,";\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  ptVar2 = (sm->transitions).super__Vector_base<transition,_std::allocator<transition>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar5 = (sm->transitions).super__Vector_base<transition,_std::allocator<transition>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar5 != ptVar2; ptVar5 = ptVar5 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(ptVar5->state_from)._M_dataplus._M_p,
                        (ptVar5->state_from)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> ",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(ptVar5->state_to)._M_dataplus._M_p,
                        (ptVar5->state_to)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  [label=\"",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(ptVar5->label)._M_dataplus._M_p,(ptVar5->label)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"];",3);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"}\n",2);
  return os;
}

Assistant:

inline std::ostream& operator <<(std::ostream& os,	fsm_def& sm)
{
    os << "digraph " << sm.name << " {\n";
    for (const auto& state : sm.get_states()) {
        os << "\t" << state << ";\n";
    }
    os << "\n";
    for (const auto& option : sm.general_options) {
        os << "\t" << option << ";\n";
    }
    os << "\n";

    for (const auto& transition : sm.transitions) {
        os << "\t" << transition << "\n";
    }
    os << "}\n";
    return os;
}